

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O0

void __thiscall wasm::WasmBinaryBuilder::verifyInt32(WasmBinaryBuilder *this,int32_t x)

{
  allocator<char> local_39;
  string local_38;
  uint32_t local_18;
  uint32_t local_14;
  int32_t y;
  int32_t x_local;
  WasmBinaryBuilder *this_local;
  
  local_14 = x;
  _y = this;
  local_18 = getInt32(this);
  if (local_14 != local_18) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"surprising value",&local_39);
    throwError(this,&local_38);
  }
  return;
}

Assistant:

void WasmBinaryBuilder::verifyInt32(int32_t x) {
  int32_t y = getInt32();
  if (x != y) {
    throwError("surprising value");
  }
}